

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,Eigen::Matrix<double,-1,1,0,-1,1>&)::CableANCF_ForceCurv::Evaluate(Eigen::
Matrix<double,12,1,0,12,1>__double_(void *this,ChVectorN<double,_12> *result,double x)

{
  DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> *this_00;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *pDVar1;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *this_01;
  DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> *this_02;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *dst;
  Scalar SVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scalar *pSVar9;
  Scalar *pSVar10;
  long lVar11;
  int i;
  long lVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double k;
  double local_1c8;
  MatrixBase<Eigen::Matrix<double,1,12,1,1,12>> *local_1c0;
  ChVectorN<double,_12> *local_1b8;
  double g;
  double f;
  ChVector<double> vr_x;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>
  local_188;
  ChVector<double> vr_xx;
  double local_150;
  undefined1 local_148 [80];
  undefined1 local_f8 [16];
  scalar_constant_op<double> local_e8;
  RhsNested local_e0;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *local_d0;
  DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> *local_c8;
  ChVector<double> result_1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>
  local_68;
  ChVectorN<double,_3> f1;
  undefined1 extraout_var [56];
  
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)((long)this + 0x260);
  local_1b8 = result;
  (**(code **)(**(long **)((long)this + 8) + 0xe0))(*(long **)((long)this + 8),pDVar1);
  this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)((long)this + 0x280);
  (**(code **)(**(long **)((long)this + 8) + 0xe8))(x,*(long **)((long)this + 8),this_01);
  this_00 = (DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> *)((long)this + 0x20);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_>::setZero(this_00);
  lVar11 = 0;
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                       (pDVar1,lVar12);
    SVar2 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)this_00,0,
                         lVar11);
    *pSVar10 = SVar2;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                       (pDVar1,lVar12);
    SVar2 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)this_00,1,
                         lVar11 + 1);
    *pSVar10 = SVar2;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                       (pDVar1,lVar12);
    SVar2 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)this_00,2,
                         lVar11 + 2);
    lVar11 = lVar11 + 3;
    *pSVar10 = SVar2;
  }
  this_02 = (DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> *)((long)this + 0x140);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_>::setZero(this_02);
  lVar11 = 0;
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                       (this_01,lVar12);
    SVar2 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)this_02,0,
                         lVar11);
    *pSVar10 = SVar2;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                       (this_01,lVar12);
    SVar2 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)this_02,1,
                         lVar11 + 1);
    *pSVar10 = SVar2;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                       (this_01,lVar12);
    SVar2 = *pSVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)this_02,2,
                         lVar11 + 2);
    lVar11 = lVar11 + 3;
    *pSVar10 = SVar2;
  }
  lVar11 = 0;
  local_f8._0_8_ = *(double *)((long)this + 0x10);
  local_f8._8_8_ = pDVar1;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,3,1,4,3>>,Eigen::Transpose<Eigen::Matrix<double,1,4,1,1,4>>,0>>
            (&vr_x,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_1,_4,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_0>_>
                    *)local_f8,(type *)0x0);
  local_f8._0_8_ = *(double *)((long)this + 0x10);
  local_f8._8_8_ = this_01;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,3,1,4,3>>,Eigen::Transpose<Eigen::Matrix<double,1,4,1,1,4>>,0>>
            (&vr_xx,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_1,_4,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_0>_>
                     *)local_f8,(type *)0x0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = vr_xx.m_data[0];
  auVar32._8_8_ = vr_xx.m_data[2];
  auVar32._0_8_ = vr_xx.m_data[2];
  auVar7._8_8_ = vr_xx.m_data[2];
  auVar7._0_8_ = vr_xx.m_data[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = vr_x.m_data[0];
  auVar30._8_8_ = vr_x.m_data[2];
  auVar30._0_8_ = vr_x.m_data[2];
  auVar5._8_8_ = vr_x.m_data[2];
  auVar5._0_8_ = vr_x.m_data[1];
  auVar15 = vunpcklpd_avx(auVar32,auVar15);
  auVar16 = vunpcklpd_avx(auVar30,auVar21);
  auVar31._0_8_ = vr_xx.m_data[1] * auVar16._0_8_;
  auVar31._8_8_ = vr_xx.m_data[2] * auVar16._8_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = vr_xx.m_data[0] * vr_x.m_data[1];
  auVar16 = vfmsub231sd_fma(auVar16,auVar21,auVar7);
  result_1.m_data._0_16_ = vfmsub213pd_fma(auVar15,auVar5,auVar31);
  result_1.m_data[2] = auVar16._0_8_;
  dVar13 = ChVector<double>::Length(&result_1);
  f = dVar13;
  dVar14 = ChVector<double>::Length(&vr_x);
  g = pow(dVar14,3.0);
  k = dVar13 / g;
  local_188.m_lhs = (LhsNested)(dVar14 * 3.0);
  local_1c8 = k;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                    *)local_148,(double *)&local_188,(StorageBaseType *)pDVar1);
  local_d0 = *(DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> **)((long)this + 0x10);
  local_1c0 = (MatrixBase<Eigen::Matrix<double,1,12,1,1,12>> *)((long)this + 0x2a0);
  local_e8.m_other = (double)local_148._16_8_;
  local_e0.m_matrix = (non_const_type)local_148._24_8_;
  local_c8 = this_00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,12,1,1,12>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Matrix<double,1,4,1,1,4>const>,Eigen::Matrix<double,4,3,1,4,3>,0>,Eigen::Matrix<double,3,12,1,3,12>,0>>
            ((Matrix<double,_1,_12,_1,_1,_12> *)local_1c0,
             (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0>,_Eigen::Matrix<double,_3,_12,_1,_3,_12>,_0>
              *)local_f8);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)((long)this + 0x3c0);
  for (; lVar11 != 0xc; lVar11 = lVar11 + 1) {
    Eigen::Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false> *)local_f8,
               (Matrix<double,_3,_12,_1,_3,_12> *)this_00,lVar11);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = vr_xx.m_data[0];
    auVar8._8_8_ = vr_xx.m_data[2];
    auVar8._0_8_ = vr_xx.m_data[1];
    auVar36._8_8_ = vr_xx.m_data[2];
    auVar36._0_8_ = vr_xx.m_data[2];
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_f8._0_8_)->m_storage).
         m_data.array[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (((non_const_type)(local_f8._0_8_ + 0xc0))->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
    dVar14 = (((non_const_type)(local_f8._0_8_ + 0x60))->
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
    ;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar14;
    auVar15 = vunpcklpd_avx(auVar36,auVar28);
    auVar16 = vunpcklpd_avx(auVar26,auVar17);
    auVar5 = vunpcklpd_avx(auVar22,auVar26);
    auVar33._0_8_ = vr_xx.m_data[1] * auVar16._0_8_;
    auVar33._8_8_ = vr_xx.m_data[2] * auVar16._8_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = vr_xx.m_data[0] * dVar14;
    auVar16 = vfmsub231sd_fma(auVar23,auVar17,auVar8);
    local_148._0_16_ = vfmsub213pd_fma(auVar15,auVar5,auVar33);
    local_148._16_8_ = auVar16._0_8_;
    local_188.m_lhs = (LhsNested)local_148;
    Eigen::Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false> *)local_f8,
               (Matrix<double,_3,_12,_1,_3,_12> *)pDVar1,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,12,1,3,12>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false> *)local_f8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_188);
    Eigen::Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false> *)local_f8,
               (Matrix<double,_3,_12,_1,_3,_12> *)this_02,lVar11);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = vr_x.m_data[0];
    auVar34._8_8_ = vr_x.m_data[2];
    auVar34._0_8_ = vr_x.m_data[2];
    auVar6._8_8_ = vr_x.m_data[2];
    auVar6._0_8_ = vr_x.m_data[1];
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         (((non_const_type)(local_f8._0_8_ + 0x60))->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         (((non_const_type)(local_f8._0_8_ + 0xc0))->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
    dVar14 = (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_f8._0_8_)->m_storage)
             .m_data.array[0];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar14;
    auVar15 = vunpcklpd_avx(auVar34,auVar29);
    auVar16 = vunpcklpd_avx(auVar24,auVar27);
    auVar5 = vunpcklpd_avx(auVar27,auVar18);
    auVar35._0_8_ = auVar16._0_8_ * auVar15._0_8_;
    auVar35._8_8_ = auVar16._8_8_ * auVar15._8_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar14 * vr_x.m_data[1];
    auVar15 = vfmsub231sd_fma(auVar19,auVar29,auVar24);
    local_148._0_16_ = vfmsub213pd_fma(auVar5,auVar6,auVar35);
    local_148._16_8_ = auVar15._0_8_;
    local_188.m_lhs = (LhsNested)local_148;
    Eigen::Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_3,_1,_false> *)local_f8,
               (Matrix<double,_3,_12,_1,_3,_12> *)pDVar1,lVar11);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,12,1,3,12>,3,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,12,1,3,12>,3,1,false>> *)local_f8,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_188);
  }
  local_f8._0_8_ = &result_1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f1,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_f8);
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_188.m_lhs = (LhsNested)(1.0 / dVar13);
    local_68.m_lhs = (LhsNested)&f1;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)local_148,(double *)&local_188,(StorageBaseType *)&local_68);
    local_e8.m_other = (double)local_148._16_8_;
    local_e0.m_matrix = (non_const_type)local_148._24_8_;
    local_d0 = pDVar1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,12,1,1,12>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const>,Eigen::Matrix<double,3,12,1,3,12>,0>>
              ((Matrix<double,_1,_12,_1,_1,_12> *)((long)this + 0x300),
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::Matrix<double,_3,_12,_1,_3,_12>,_0>
                *)local_f8);
  }
  else {
    local_f8._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f1;
    local_f8._8_8_ = pDVar1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,12,1,1,12>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Matrix<double,3,12,1,3,12>,0>>
              ((Matrix<double,_1,_12,_1,_1,_12> *)((long)this + 0x300),
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_12,_1,_3,_12>,_0>
                *)local_f8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,1,12,1,1,12>>::operator*
            (&local_188,(MatrixBase<Eigen::Matrix<double,1,12,1,1,12>> *)((long)this + 0x300),&g);
  Eigen::MatrixBase<Eigen::Matrix<double,1,12,1,1,12>>::operator*(&local_68,local_1c0,&f);
  local_148._8_8_ = local_188.m_lhs;
  local_148._24_8_ = local_188.m_rhs.m_functor.m_other;
  local_148._40_8_ = local_68.m_lhs;
  local_148._56_8_ = local_68.m_rhs.m_functor.m_other;
  local_150 = 1.0 / (g * g);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,12,1,1,12>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,12,1,1,12>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>
               *)local_f8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,12,1,1,12>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,12,1,1,12>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>const>>
               *)local_148,&local_150);
  dst = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)((long)this + 0x360);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,12,1,1,12>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,12,1,1,12>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,12,1,1,12>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const>>
            ((Matrix<double,_1,_12,_1,_1,_12> *)dst,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>
              *)local_f8);
  if (*(char *)(*(long *)((long)this + 8) + 0x60) == '\x01') {
    uVar3 = *(ulong *)(*(long *)((long)this + 8) + 0x68);
    local_f8._8_8_ = *(undefined8 *)((long)this + 0x18);
    local_f8._0_8_ = dst;
    auVar20._0_8_ =
         Eigen::
         DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_12,_1,_1,_12>,_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>,_0>
         ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_12,_1,_1,_12>,_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>,_0>
                  *)local_f8,0,0);
    auVar20._8_56_ = extraout_var;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar3;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_1c8;
    auVar15 = vfmadd213sd_fma(auVar20._0_16_,auVar25,auVar4);
    k = auVar15._0_8_;
  }
  local_148._0_8_ = dst;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>
                    *)local_f8,&k,(StorageBaseType *)local_148);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,12,1,0,12,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,12,1,1,12>>const>>
            (local_1b8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_12,_1,_1,_12>_>_>
              *)local_f8);
  return;
}

Assistant:

virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);
            element->ShapeFunctionsDerivatives2(Ndd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            // Sdd=[Ndd1*eye(3) Ndd2*eye(3) Ndd3*eye(3) Ndd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Sdd.setZero();
            for (int i = 0; i < 4; i++) {
                Sdd(0, 3 * i + 0) = Ndd(i);
                Sdd(1, 3 * i + 1) = Ndd(i);
                Sdd(2, 3 * i + 2) = Ndd(i);
            }

            ChVector<> vr_x((*d).transpose() * Nd.transpose());
            ChVector<> vr_xx((*d).transpose() * Ndd.transpose());
            ChVector<> vf1 = Vcross(vr_x, vr_xx);
            double f = vf1.Length();
            double g1 = vr_x.Length();
            double g = pow(g1, 3);
            double k = f / g;

            g_e = (3 * g1) * Nd * (*d) * Sd;

            // do:  fe1=cross(Sd,r_xxrep)+cross(r_xrep,Sdd);
            for (int col = 0; col < 12; ++col) {
                ChVector<> Sd_i = Sd.col(col);
                fe1.col(col) = Vcross(Sd_i, vr_xx).eigen();
                ChVector<> Sdd_i = Sdd.col(col);
                fe1.col(col) += Vcross(vr_x, Sdd_i).eigen();
            }
            ChVectorN<double, 3> f1 = vf1.eigen();

            if (f == 0)
                f_e = f1.transpose() * fe1;
            else {
                f_e = (1 / f) * f1.transpose() * fe1;
            }

            k_e = (f_e * g - g_e * f) * (1 / (pow(g, 2)));

            // Add damping if selected by user: curvature rate
            if (element->m_use_damping)
                k += (element->m_alpha) * (k_e * (*d_dt))(0, 0);

            result = k * k_e.transpose();
        }